

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O0

size_t u64Weight(u64 w)

{
  ulong uVar1;
  u64 w_local;
  
  uVar1 = w - (w >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
  uVar1 = uVar1 + (uVar1 >> 4) & 0xf0f0f0f0f0f0f0f;
  uVar1 = (uVar1 >> 8) + uVar1;
  uVar1 = (uVar1 >> 0x10) + uVar1;
  return (uVar1 >> 0x20) + uVar1 & 0x7f;
}

Assistant:

size_t u64Weight(register u64 w)
{
	w -= ((w >> 1) & 0x5555555555555555);
	w = (w & 0x3333333333333333) + ((w >> 2) & 0x3333333333333333);
	w = (w + (w >> 4)) & 0x0F0F0F0F0F0F0F0F;
	w += w >> 8;
	w += w >> 16;
	w += w >> 32;
	return (size_t)(w & 0x000000000000007F);
}